

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsInput anon_unknown.dwarf_694c0::findOrCreateInput(HelicsFederate fed,Input *input)

{
  int iVar1;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *puVar2;
  __normal_iterator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_*,_std::vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>_>
  _Var3;
  InputObject *pIVar4;
  __single_object inp;
  InterfaceHandle handle;
  _Head_base<0UL,_helics::InputObject_*,_false> local_48;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> local_40;
  int local_34;
  __shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  iVar1 = (input->super_Interface).handle.hid;
  puVar2 = *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
            ((long)fed + 0x58);
  local_34 = iVar1;
  _Var3 = std::
          upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>*,std::vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>>,helics::InterfaceHandle,(anonymous_namespace)::__0>
                    (*(undefined8 *)((long)fed + 0x50),puVar2);
  if ((_Var3._M_current == puVar2) ||
     (pIVar4 = ((_Var3._M_current)->_M_t).
               super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>
               .super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl,
     (pIVar4->inputPtr->super_Interface).handle.hid != iVar1)) {
    std::make_unique<helics::InputObject>();
    (local_48._M_head_impl)->inputPtr = input;
    getValueFedSharedPtr(&local_30,(HelicsError *)fed);
    std::__shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_48._M_head_impl)->fedptr).
                super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>,&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    local_40._M_t.
    super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
    super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl =
         (__uniq_ptr_data<helics::InputObject,_std::default_delete<helics::InputObject>,_true,_true>
         )(__uniq_ptr_data<helics::InputObject,_std::default_delete<helics::InputObject>,_true,_true>
           )local_48._M_head_impl;
    local_48._M_head_impl = (InputObject *)0x0;
    pIVar4 = (InputObject *)addInput(fed,&local_40);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              (&local_40);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               &local_48);
  }
  return pIVar4;
}

Assistant:

HelicsInput findOrCreateInput(HelicsFederate fed, helics::Input& input)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    const auto handle = input.getHandle();
    auto ind = std::upper_bound(fedObj->inputs.begin(), fedObj->inputs.end(), handle, inputSearch);
    if (ind != fedObj->inputs.end() && (*ind)->inputPtr->getHandle() == handle) {
        HelicsInput hinp = ind->get();
        return hinp;
    }
    auto inp = std::make_unique<helics::InputObject>();
    inp->inputPtr = &input;
    inp->fedptr = getValueFedSharedPtr(fed, nullptr);
    return addInput(fed, std::move(inp));
}